

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

bool IfProtected(int player,int to,Situation *situation,int exp)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ushort uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  UINT8 *pUVar12;
  long lVar13;
  
  lVar8 = (long)to;
  if ((situation->current_board[lVar8] != 0) &&
     ((uint)((situation->current_board[lVar8] & 0x10) == 0) != player)) {
    return false;
  }
  iVar9 = player * 0x10;
  uVar1 = iVar9 + 0x10;
  if ((to & 0x80U) == player << 7) {
    lVar4 = (long)(to + -1) + -2;
    do {
      if (((lVar4 - exp != -2) && ((uVar1 & situation->current_board[lVar4 + 2]) != 0)) &&
         (10 < (situation->current_board[lVar4 + 2] & 0xf))) {
        return true;
      }
      lVar4 = lVar4 + 2;
    } while (lVar4 < lVar8);
  }
  else {
    pUVar12 = LEGAL_POSITION[player] + lVar8;
    iVar5 = to + 0x100;
    lVar4 = (long)(int)uVar1;
    bVar2 = situation->current_pieces[lVar4];
    if ((((bVar2 != 0) && ((*pUVar12 & 2) != 0)) && ((uint)bVar2 != exp)) &&
       (""[(int)(iVar5 - (uint)bVar2)] == '\x01')) {
      return true;
    }
    lVar10 = lVar4;
    do {
      bVar2 = situation->current_pieces[lVar10 + 1];
      if (((bVar2 != 0) && ((*pUVar12 & 4) != 0)) &&
         (((uint)bVar2 != exp && (""[(int)(iVar5 - (uint)bVar2)] == '\x02')))) {
        return true;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar9 + 0x12);
    do {
      if (((situation->current_pieces[lVar4 + 3] != 0) && ((*pUVar12 & 0x10) != 0)) &&
         ((uVar3 = (uint)situation->current_pieces[lVar4 + 3], ""[(int)(iVar5 - uVar3)] == '\x03' &&
          ((uVar3 != exp && (situation->current_board[(int)(uVar3 + to) >> 1] == '\0')))))) {
        return true;
      }
      lVar10 = lVar4 + 3;
      lVar4 = lVar4 + 1;
    } while (lVar10 < iVar9 + 0x14);
  }
  lVar4 = (long)(int)uVar1;
  lVar10 = lVar4;
  do {
    if (situation->current_pieces[lVar10 + 5] != 0) {
      uVar3 = (uint)situation->current_pieces[lVar10 + 5];
      if (((HORSE_LEGAL_MOVE[(int)((to + 0x100) - uVar3)] != 0) && (uVar3 != exp)) &&
         (situation->current_board[(int)(HORSE_LEGAL_MOVE[(int)((to + 0x100) - uVar3)] + uVar3)] ==
          '\0')) {
        return true;
      }
    }
    lVar13 = lVar10 + 5;
    lVar10 = lVar10 + 1;
  } while (lVar13 < iVar9 + 0x16);
  uVar3 = to & 0xf;
  uVar6 = to >> 4;
  lVar10 = lVar4;
  do {
    bVar2 = situation->current_pieces[lVar10 + 7];
    if ((uint)bVar2 != to && bVar2 != 0) {
      uVar11 = bVar2 & 0xf;
      if (bVar2 >> 4 == uVar6) {
        if ((uint)bVar2 != exp) {
          uVar7 = BIT_ROW_MASK[lVar8] &
                  *(ushort *)
                   ((ulong)(uVar11 << 0xc) + 0x322d52 + (ulong)situation->bit_row[uVar6] * 8);
joined_r0x00109d83:
          if (uVar7 != 0) {
            return true;
          }
        }
      }
      else if ((uVar11 == uVar3) && ((uint)bVar2 != exp)) {
        uVar7 = BIT_COL_MASK[lVar8] &
                *(ushort *)
                 ((ulong)(bVar2 >> 4) * 0x2000 + 0x328d52 + (ulong)situation->bit_col[uVar3] * 8);
        goto joined_r0x00109d83;
      }
    }
    lVar13 = lVar10 + 7;
    lVar10 = lVar10 + 1;
  } while (lVar13 < iVar9 + 0x18);
  do {
    bVar2 = situation->current_pieces[lVar4 + 9];
    if ((uint)bVar2 != to && bVar2 != 0) {
      uVar11 = bVar2 & 0xf;
      if (bVar2 >> 4 == uVar6) {
        if ((uint)bVar2 != exp) {
          uVar7 = BIT_ROW_MASK[lVar8] &
                  *(ushort *)
                   ((ulong)(uVar11 << 0xc) + 0x322d54 + (ulong)situation->bit_row[uVar6] * 8);
joined_r0x00109e42:
          if (uVar7 != 0) {
            return true;
          }
        }
      }
      else if ((uVar11 == uVar3) && ((uint)bVar2 != exp)) {
        uVar7 = BIT_COL_MASK[lVar8] &
                *(ushort *)
                 ((ulong)(bVar2 >> 4) * 0x2000 + 0x328d54 + (ulong)situation->bit_col[uVar3] * 8);
        goto joined_r0x00109e42;
      }
    }
    lVar10 = lVar4 + 9;
    lVar4 = lVar4 + 1;
    if (iVar9 + 0x1a <= lVar10) {
      iVar9 = to + player * -0x20 + 0x10;
      return (iVar9 != exp && (uVar1 & situation->current_board[iVar9]) != 0) &&
             10 < (situation->current_board[iVar9] & 0xf);
    }
  } while( true );
}

Assistant:

bool IfProtected(int player, const int to, const Situation & situation, int exp){
    // 对手的player_flag
    int player_flag = GetPlayerFlag(player);

    // 对手的棋子所在的位置，即判断保护的from
    int from;
    if(situation.current_board[to] != 0 && ColorOfPiece(situation.current_board[to]) != player) 
        return false;
    
    // 是否过河
    if(InHomeHalf(to, player)){
        // 被将(帅)保护
        for(int i = player_flag + 0; i <= player_flag + 0; i ++){
            from = situation.current_pieces[i];
            if (from && (LEGAL_POSITION[player][to] & POSITION_MASK[0]) && (LEGAL_MOVE[to - from + 256] == 1) && from != exp)
                return true;
        }

        // 被士(仕)保护
        for(int i = player_flag + 1; i <= player_flag + 2; i ++){
            from = situation.current_pieces[i];
            if (from && (LEGAL_POSITION[player][to] & POSITION_MASK[1]) && (LEGAL_MOVE[to - from + 256] == 2) && from != exp)
                return true;
        }

        // 被象(相)保护
        for(int i = player_flag + 3; i <= player_flag + 4; i ++){
            from = situation.current_pieces[i];
            if(from && (LEGAL_POSITION[player][to] & POSITION_MASK[2]) && (LEGAL_MOVE[to - from + 256] == 3) && (situation.current_board[(to + from) >> 1] == 0) && from != exp)
                return true;
        }
    }
    else{
        // 被兵保护(横向)
        for(from = to - 1; from <= to + 1; from += 2){
            int from_id = situation.current_board[from];
            if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11) && from != exp)
                return true;
        }
    }

    // 被马保护
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        from = situation.current_pieces[i];
        int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
        if(from && horse_leg != from && situation.current_board[horse_leg] == 0 && from != exp)
            return true;
    }

    int from_col = GetCol(from), from_row = GetRow(from), to_col = GetCol(to), to_row = GetRow(to);

    // 被车保护
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        from = situation.current_pieces[i];
        from_col = GetCol(from);
        from_row = GetRow(from);
        if(from && from != to){
            if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0 && from != exp)
                    return true;
            }
            else if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0 && from != exp)
                    return true;
            }
        }
    }

    // 被炮保护
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        from = situation.current_pieces[i];
        from_col = GetCol(from);
        from_row = GetRow(from);
        if(from && from != to){
            if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0 && from != exp)
                    return true;
            }
            else if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0 && from != exp)
                    return true;
            }
        }
    }

    // 被兵保护(纵向)
    from = SquareBack(to, player);
    int from_id = situation.current_board[from];
    if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11) && from != exp)
        return true;

    return false;
}